

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuilder.cpp
# Opt level: O0

node * __thiscall YAML::NodeBuilder::Push(NodeBuilder *this,Mark *mark,anchor_t anchor)

{
  node *this_00;
  anchor_t in_RDX;
  NodeBuilder *in_RSI;
  node *in_RDI;
  NodeBuilder *unaff_retaddr;
  node *node;
  node *node_00;
  
  node_00 = in_RDI;
  std::__shared_ptr_access<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0xf0c225);
  this_00 = detail::memory_holder::create_node((memory_holder *)0xf0c22d);
  detail::node::set_mark(this_00,(Mark *)in_RDI);
  RegisterAnchor(in_RSI,in_RDX,this_00);
  Push(unaff_retaddr,node_00);
  return this_00;
}

Assistant:

detail::node& NodeBuilder::Push(const Mark& mark, anchor_t anchor) {
  detail::node& node = m_pMemory->create_node();
  node.set_mark(mark);
  RegisterAnchor(anchor, node);
  Push(node);
  return node;
}